

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

pair<std::pair<const_int,_int>_*,_std::pair<const_int,_int>_*> __thiscall
frozen::unordered_map<int,_int,_3UL,_frozen::elsa<int>,_std::equal_to<int>_>::equal_range<int>
          (unordered_map<int,_int,_3UL,_frozen::elsa<int>,_std::equal_to<int>_> *this,int *key)

{
  pair<std::pair<const_int,_int>_*,_std::pair<const_int,_int>_*> pVar1;
  int *key_local;
  unordered_map<int,_int,_3UL,_frozen::elsa<int>,_std::equal_to<int>_> *this_local;
  
  pVar1 = unordered_map<int,int,3ul,frozen::elsa<int>,std::equal_to<int>>::
          equal_range_impl<frozen::unordered_map<int,int,3ul,frozen::elsa<int>,std::equal_to<int>>&,int>
                    (this,key);
  return pVar1;
}

Assistant:

constexpr std::pair<iterator, iterator> equal_range(KeyType const &key) {
    return equal_range_impl(*this, key);
  }